

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O2

void testing::internal::InitGoogleMockImpl<wchar_t>(int *argc,wchar_t **argv)

{
  _Alloc_hider str;
  bool bVar1;
  bool bVar2;
  int iVar3;
  wchar_t **extraout_RDX;
  wchar_t **streamable;
  bool *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_01;
  int32_t *value_02;
  wchar_t **extraout_RDX_00;
  int iVar4;
  long lVar5;
  bool value;
  undefined3 uStack_6f;
  string arg_string;
  
  testing::InitGoogleTest(argc,argv);
  iVar3 = *argc;
  if (0 < iVar3) {
    streamable = extraout_RDX;
    for (iVar4 = 1; iVar4 != iVar3; iVar4 = iVar4 + 1) {
      lVar5 = (long)iVar4;
      StreamableToString<wchar_t*>(&arg_string,(internal *)(argv + lVar5),streamable);
      str = arg_string._M_dataplus;
      _value = CONCAT31(uStack_6f,FLAGS_gmock_catch_leaked_mocks);
      bVar1 = ParseGoogleMockFlag(arg_string._M_dataplus._M_p,&value,value_00);
      if (bVar1) {
        FLAGS_gmock_catch_leaked_mocks = value;
LAB_00113968:
        iVar3 = *argc;
        for (; iVar3 != lVar5; lVar5 = lVar5 + 1) {
          argv[lVar5] = argv[lVar5 + 1];
        }
        *argc = iVar3 + -1;
        iVar4 = iVar4 + -1;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&value,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   FLAGS_gmock_verbose_abi_cxx11_);
        bVar1 = ParseGoogleMockFlag<std::__cxx11::string>(str._M_p,(char *)&value,value_01);
        if (bVar1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gmock_verbose_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
        }
        std::__cxx11::string::~string((string *)&value);
        if (!bVar1) {
          _value = FLAGS_gmock_default_mock_behavior;
          bVar2 = ParseGoogleMockFlag(str._M_p,&value,value_02);
          if (bVar2) {
            FLAGS_gmock_default_mock_behavior = _value;
            bVar1 = true;
          }
        }
        if (bVar1) goto LAB_00113968;
      }
      std::__cxx11::string::~string((string *)&arg_string);
      iVar3 = *argc;
      streamable = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void InitGoogleMockImpl(int* argc, CharType** argv) {
  // Makes sure Google Test is initialized.  InitGoogleTest() is
  // idempotent, so it's fine if the user has already called it.
  InitGoogleTest(argc, argv);
  if (*argc <= 0) return;

  for (int i = 1; i != *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    // Do we see a Google Mock flag?
    bool found_gmock_flag = false;

#define GMOCK_INTERNAL_PARSE_FLAG(flag_name)            \
  if (!found_gmock_flag) {                              \
    auto value = GMOCK_FLAG_GET(flag_name);             \
    if (ParseGoogleMockFlag(arg, #flag_name, &value)) { \
      GMOCK_FLAG_SET(flag_name, value);                 \
      found_gmock_flag = true;                          \
    }                                                   \
  }

    GMOCK_INTERNAL_PARSE_FLAG(catch_leaked_mocks)
    GMOCK_INTERNAL_PARSE_FLAG(verbose)
    GMOCK_INTERNAL_PARSE_FLAG(default_mock_behavior)

    if (found_gmock_flag) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }
}